

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void luaC_step(lua_State *L)

{
  global_State *g;
  ulong uVar1;
  lu_mem lVar2;
  GCObject **ppGVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  GCObject *dummy;
  
  g = L->l_G;
  if (g->gcstp != '\0') {
    lVar4 = -2000;
LAB_0013cc0f:
    luaE_setdebt(g,lVar4);
    return;
  }
  uVar1 = g->lastatomic;
  if (g->gckind == '\x01') {
    if (uVar1 == 0) {
      uVar1 = g->GCestimate;
      if ((g->GCdebt < 1) ||
         (uVar5 = (ulong)g->genmajormul * (uVar1 / 100) * 4,
         (ulong)(g->GCdebt + g->totalbytes) <= uVar5 + uVar1)) {
        if (g->firstold1 != (GCObject *)0x0) {
          markold(g,g->firstold1,g->reallyold);
          g->firstold1 = (GCObject *)0x0;
        }
        markold(g,g->finobj,g->finobjrold);
        markold(g,g->tobefnz,(GCObject *)0x0);
        atomic(L);
        g->gcstate = '\x03';
        ppGVar3 = sweepgen(L,g,&g->allgc,g->survival,&g->firstold1);
        sweepgen(L,g,ppGVar3,g->old1,&g->firstold1);
        g->reallyold = g->old1;
        g->old1 = *ppGVar3;
        g->survival = g->allgc;
        dummy = (GCObject *)0x0;
        ppGVar3 = sweepgen(L,g,&g->finobj,g->finobjsur,&dummy);
        sweepgen(L,g,ppGVar3,g->finobjold1,&dummy);
        g->finobjrold = g->finobjold1;
        g->finobjold1 = *ppGVar3;
        g->finobjsur = g->finobj;
        sweepgen(L,g,&g->tobefnz,(GCObject *)0x0,&dummy);
        finishgencycle(L,g);
        setminordebt(g);
        g->GCestimate = uVar1;
        return;
      }
      lVar2 = fullgen(L,g);
      if ((ulong)(g->GCdebt + g->totalbytes) < (uVar5 >> 1) + uVar1) {
        return;
      }
      g->lastatomic = lVar2;
LAB_0013cef0:
      setpause(g);
      return;
    }
    enterinc(g);
  }
  else if (uVar1 == 0) {
    lVar4 = (ulong)g->gcstepmul * 4 + 1;
    lVar7 = ((ulong)g->GCdebt >> 4) * lVar4;
    lVar6 = 0x7fffffffffffffff;
    if (g->gcstepsize < 0x3f) {
      lVar6 = ((ulong)(1L << (g->gcstepsize & 0x3f)) >> 4) * lVar4;
    }
    do {
      lVar2 = singlestep(L);
      lVar7 = lVar7 - lVar2;
      if (lVar7 == -lVar6 || SBORROW8(lVar7,-lVar6) != lVar7 + lVar6 < 0) {
        if (g->gcstate != '\b') {
          lVar4 = lVar7 / lVar4 << 4;
          goto LAB_0013cc0f;
        }
        break;
      }
    } while (g->gcstate != '\b');
    goto LAB_0013cef0;
  }
  luaC_runtilstate(L,1);
  lVar2 = atomic(L);
  if ((uVar1 >> 3) + uVar1 <= lVar2) {
    g->GCestimate = g->GCdebt + g->totalbytes;
    entersweep(L);
    luaC_runtilstate(L,0x100);
    setpause(g);
    g->lastatomic = lVar2;
    return;
  }
  atomic2gen(L,g);
  setminordebt(g);
  return;
}

Assistant:

void luaC_step (lua_State *L) {
  global_State *g = G(L);
  if (!gcrunning(g))  /* not running? */
    luaE_setdebt(g, -2000);
  else {
    if(isdecGCmodegen(g))
      genstep(L, g);
    else
      incstep(L, g);
  }
}